

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

int32 ps_lattice_posterior_prune(ps_lattice_t *dag,int32 beam)

{
  latlink_list_s *plVar1;
  latlink_list_t *next;
  latlink_list_t *tmp;
  latlink_list_t *x;
  ps_latlink_t *ppStack_20;
  int npruned;
  ps_latlink_t *link;
  int32 beam_local;
  ps_lattice_t *dag_local;
  
  x._4_4_ = 0;
  ppStack_20 = ps_lattice_traverse_edges(dag,dag->start,dag->end);
  while (ppStack_20 != (ps_latlink_t *)0x0) {
    ppStack_20->from->reachable = 0;
    if ((ppStack_20->alpha + ppStack_20->beta) - dag->norm < beam) {
      next = (latlink_list_t *)0x0;
      tmp = ppStack_20->from->exits;
      while (tmp != (latlink_list_t *)0x0) {
        plVar1 = tmp->next;
        if (tmp->link == ppStack_20) {
          __listelem_free__(dag->latlink_list_alloc,tmp,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                            ,0x604);
          tmp = plVar1;
        }
        else {
          tmp->next = next;
          next = tmp;
          tmp = plVar1;
        }
      }
      ppStack_20->from->exits = next;
      next = (latlink_list_t *)0x0;
      tmp = ppStack_20->to->entries;
      while (tmp != (latlink_list_t *)0x0) {
        plVar1 = tmp->next;
        if (tmp->link == ppStack_20) {
          __listelem_free__(dag->latlink_list_alloc,tmp,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                            ,0x610);
          tmp = plVar1;
        }
        else {
          tmp->next = next;
          next = tmp;
          tmp = plVar1;
        }
      }
      ppStack_20->to->entries = next;
      __listelem_free__(dag->latlink_alloc,ppStack_20,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                        ,0x618);
      x._4_4_ = x._4_4_ + 1;
    }
    ppStack_20 = ps_lattice_traverse_next(dag,dag->end);
  }
  dag_mark_reachable(dag->end);
  ps_lattice_delete_unreachable(dag);
  return x._4_4_;
}

Assistant:

int32
ps_lattice_posterior_prune(ps_lattice_t *dag, int32 beam)
{
    ps_latlink_t *link;
    int npruned = 0;

    for (link = ps_lattice_traverse_edges(dag, dag->start, dag->end);
         link; link = ps_lattice_traverse_next(dag, dag->end)) {
        link->from->reachable = FALSE;
        if (link->alpha + link->beta - dag->norm < beam) {
            latlink_list_t *x, *tmp, *next;
            tmp = NULL;
            for (x = link->from->exits; x; x = next) {
                next = x->next;
                if (x->link == link) {
                    listelem_free(dag->latlink_list_alloc, x);
                }
                else {
                    x->next = tmp;
                    tmp = x;
                }
            }
            link->from->exits = tmp;
            tmp = NULL;
            for (x = link->to->entries; x; x = next) {
                next = x->next;
                if (x->link == link) {
                    listelem_free(dag->latlink_list_alloc, x);
                }
                else {
                    x->next = tmp;
                    tmp = x;
                }
            }
            link->to->entries = tmp;
            listelem_free(dag->latlink_alloc, link);
            ++npruned;
        }
    }
    dag_mark_reachable(dag->end);
    ps_lattice_delete_unreachable(dag);
    return npruned;
}